

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*>::
emplace<QtPrivate::QMetaTypeInterface_const*const&>
          (QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *this,QByteArray *key,
          QMetaTypeInterface **args)

{
  long lVar1;
  QByteArray *in_RDX;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *in_RSI;
  long in_FS_OFFSET;
  piter pVar2;
  QByteArray copy;
  QByteArray *in_stack_ffffffffffffff68;
  QByteArray *in_stack_ffffffffffffff70;
  QMetaTypeInterface **in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pVar2 = (piter)emplace<QtPrivate::QMetaTypeInterface_const*const&>
                           (in_RSI,in_RDX,in_stack_ffffffffffffffa8);
  QByteArray::~QByteArray((QByteArray *)0x3d3ec5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }